

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputSource_private.hh
# Opt level: O1

bool __thiscall InputSource::fastRead(InputSource *this,char *ch)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar3;
  
  do {
    while( true ) {
      lVar1 = this->buf_len;
      if (this->buf_idx < lVar1) {
        *ch = this->buffer[this->buf_idx];
        this->buf_idx = this->buf_idx + 1;
        this->last_offset = this->last_offset + 1;
        return true;
      }
      if (lVar1 == 0) {
        return false;
      }
      (*this->_vptr_InputSource[5])(this,lVar1 + this->buf_start,0);
      if (this->buf_len != 0) break;
LAB_001e5536:
      this->buf_idx = 0;
      iVar2 = (*this->_vptr_InputSource[7])(this,this->buffer,0x80);
      this->buf_len = CONCAT44(extraout_var_00,iVar2);
      this->buf_start = this->last_offset;
    }
    iVar2 = (*this->_vptr_InputSource[4])(this);
    lVar3 = CONCAT44(extraout_var,iVar2);
    lVar1 = this->buf_start;
    if ((lVar3 < lVar1) || (lVar1 + this->buf_len <= lVar3)) goto LAB_001e5536;
    this->last_offset = lVar3;
    this->buf_idx = lVar3 - lVar1;
  } while( true );
}

Assistant:

inline bool
InputSource::fastRead(char& ch)
{
    // Before calling fastRead, fastTell must be called to prepare the buffer. Once reading is
    // complete, fastUnread must be called to set the correct file position.
    if (buf_idx < buf_len) {
        ch = buffer[buf_idx];
        ++(buf_idx);
        ++(last_offset);
        return true;

    } else if (buf_len == 0) {
        return false;
    } else {
        seek(buf_start + buf_len, SEEK_SET);
        fastTell();
        return fastRead(ch);
    }
}